

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_font * nk_font_atlas_add_from_memory
                    (nk_font_atlas *atlas,void *memory,nk_size size,float height,
                    nk_font_config *config)

{
  nk_font_config local_e8;
  undefined1 local_90 [8];
  nk_font_config cfg;
  nk_font_config *config_local;
  float height_local;
  nk_size size_local;
  void *memory_local;
  nk_font_atlas *atlas_local;
  
  cfg.p = config;
  if (memory == (void *)0x0) {
    __assert_fail("memory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x34b8,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (size == 0) {
    __assert_fail("size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x34b9,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x34bb,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  if ((atlas->temporary).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->temporary).free == (nk_plugin_free)0x0) {
      __assert_fail("atlas->temporary.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x34bd,
                    "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                   );
    }
    if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
      if ((atlas->permanent).free != (nk_plugin_free)0x0) {
        if ((((atlas == (nk_font_atlas *)0x0) || ((atlas->temporary).alloc == (nk_plugin_alloc)0x0))
            || ((atlas->temporary).free == (nk_plugin_free)0x0)) ||
           (((memory == (void *)0x0 || (size == 0)) ||
            (((atlas->permanent).alloc == (nk_plugin_alloc)0x0 ||
             ((atlas->permanent).free == (nk_plugin_free)0x0)))))) {
          atlas_local = (nk_font_atlas *)0x0;
        }
        else {
          if (config == (nk_font_config *)0x0) {
            nk_font_config(&local_e8,height);
            memcpy(local_90,&local_e8,0x58);
          }
          else {
            memcpy(local_90,config,0x58);
          }
          cfg.ttf_size._0_1_ = 0;
          cfg.next = (nk_font_config *)memory;
          cfg.ttf_blob = (void *)size;
          cfg._24_4_ = height;
          atlas_local = (nk_font_atlas *)nk_font_atlas_add(atlas,(nk_font_config *)local_90);
        }
        return (nk_font *)atlas_local;
      }
      __assert_fail("atlas->permanent.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                    ,0x34bf,
                    "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                   );
    }
    __assert_fail("atlas->permanent.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x34be,
                  "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
                 );
  }
  __assert_fail("atlas->temporary.alloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                ,0x34bc,
                "struct nk_font *nk_font_atlas_add_from_memory(struct nk_font_atlas *, void *, nk_size, float, const struct nk_font_config *)"
               );
}

Assistant:

NK_API struct nk_font*
nk_font_atlas_add_from_memory(struct nk_font_atlas *atlas, void *memory,
    nk_size size, float height, const struct nk_font_config *config)
{
    struct nk_font_config cfg;
    NK_ASSERT(memory);
    NK_ASSERT(size);

    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->temporary.alloc || !atlas->temporary.free || !memory || !size ||
        !atlas->permanent.alloc || !atlas->permanent.free)
        return 0;

    cfg = (config) ? *config: nk_font_config(height);
    cfg.ttf_blob = memory;
    cfg.ttf_size = size;
    cfg.size = height;
    cfg.ttf_data_owned_by_atlas = 0;
    return nk_font_atlas_add(atlas, &cfg);
}